

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractbutton.cpp
# Opt level: O0

void __thiscall QAbstractButtonPrivate::moveFocus(QAbstractButtonPrivate *this,int key)

{
  QWidget *this_00;
  byte bVar1;
  bool bVar2;
  FocusPolicy FVar3;
  FocusPolicy FVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  QButtonGroupPrivate *pQVar8;
  QWidget *pQVar9;
  qsizetype qVar10;
  const_reference ppQVar11;
  QWidget *pQVar12;
  QWidget *pQVar13;
  QAbstractButtonPrivate *pQVar14;
  int in_ESI;
  long in_RDI;
  long in_FS_OFFSET;
  bool bVar15;
  int score;
  QAbstractButton *button;
  int i;
  uint focus_flag;
  int bestScore;
  QAbstractButton *candidate;
  QWidget *f;
  bool exclusive;
  QPoint p;
  QRect buttonRect;
  QPoint goal;
  QRect target;
  QAbstractButton *fb;
  QList<QAbstractButton_*> buttonList;
  int in_stack_fffffffffffffe78;
  int in_stack_fffffffffffffe7c;
  int in_stack_fffffffffffffe80;
  int in_stack_fffffffffffffe84;
  int in_stack_fffffffffffffe88;
  int in_stack_fffffffffffffe8c;
  QWidget *in_stack_fffffffffffffe90;
  int in_stack_fffffffffffffe98;
  int in_stack_fffffffffffffe9c;
  int in_stack_fffffffffffffea0;
  int in_stack_fffffffffffffea4;
  int in_stack_fffffffffffffeb0;
  int in_stack_fffffffffffffeb4;
  int in_stack_fffffffffffffeb8;
  FocusReason in_stack_fffffffffffffebc;
  int in_stack_fffffffffffffec0;
  int in_stack_fffffffffffffec4;
  int local_ec;
  int local_dc;
  int local_d4;
  QWidget *local_d0;
  int local_a8;
  int local_a4;
  int local_a0;
  int local_9c;
  QPoint local_98;
  QPoint local_88;
  QRect local_80;
  undefined1 local_70 [16];
  QPoint local_60;
  QPoint local_50;
  QRect local_48;
  undefined1 local_38 [16];
  QAbstractButton *local_28;
  QList<QAbstractButton_*> local_20;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_20.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_20.d.ptr = (QAbstractButton **)&DAT_aaaaaaaaaaaaaaaa;
  local_20.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  queryButtonList((QAbstractButtonPrivate *)
                  CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
  if (*(long *)(in_RDI + 0x290) == 0) {
    bVar1 = *(byte *)(in_RDI + 0x28c) >> 3;
  }
  else {
    pQVar8 = QButtonGroup::d_func((QButtonGroup *)0x4fe53b);
    bVar1 = pQVar8->exclusive;
  }
  bVar15 = (bVar1 & 1) != 0;
  pQVar9 = QApplication::focusWidget();
  local_28 = qobject_cast<QAbstractButton*>((QObject *)0x4fe59c);
  if ((local_28 != (QAbstractButton *)0x0) &&
     (bVar2 = QListSpecialMethodsBase<QAbstractButton*>::contains<QAbstractButton*>
                        ((QListSpecialMethodsBase<QAbstractButton_*> *)
                         CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                         (QAbstractButton **)
                         CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78)), bVar2)) {
    local_d0 = (QWidget *)0x0;
    local_d4 = -1;
    local_38._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_38._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_48 = QWidget::rect((QWidget *)
                             CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
    QPoint::QPoint((QPoint *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                   in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78);
    local_50 = QWidget::mapToGlobal
                         (in_stack_fffffffffffffe90,
                          (QPoint *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
    local_38 = (undefined1  [16])
               QRect::translated((QRect *)CONCAT44(in_stack_fffffffffffffebc,
                                                   in_stack_fffffffffffffeb8),
                                 (QPoint *)
                                 CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
    local_60 = (QPoint)&DAT_aaaaaaaaaaaaaaaa;
    local_60 = QRect::center((QRect *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0))
    ;
    bVar2 = qt_tab_all_widgets();
    FVar3 = StrongFocus;
    if (bVar2) {
      FVar3 = TabFocus;
    }
    for (local_dc = 0; qVar10 = QList<QAbstractButton_*>::size(&local_20), local_dc < qVar10;
        local_dc = local_dc + 1) {
      ppQVar11 = QList<QAbstractButton_*>::at
                           ((QList<QAbstractButton_*> *)
                            CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                            CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
      this_00 = &(*ppQVar11)->super_QWidget;
      if (this_00 != pQVar9) {
        pQVar12 = QWidget::window(in_stack_fffffffffffffe90);
        pQVar13 = QWidget::window(in_stack_fffffffffffffe90);
        if (((pQVar12 == pQVar13) && (bVar2 = QWidget::isEnabled((QWidget *)0x4fe778), bVar2)) &&
           ((bVar2 = QWidget::isHidden((QWidget *)0x4fe78e), !bVar2 &&
            ((bVar15 || (FVar4 = QWidget::focusPolicy(this_00), (FVar4 & FVar3) == FVar3)))))) {
          local_70._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
          local_70._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
          local_80 = QWidget::rect((QWidget *)
                                   CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
          QPoint::QPoint((QPoint *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                         in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78);
          local_88 = QWidget::mapToGlobal
                               (in_stack_fffffffffffffe90,
                                (QPoint *)
                                CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
          local_70 = (undefined1  [16])
                     QRect::translated((QRect *)CONCAT44(in_stack_fffffffffffffebc,
                                                         in_stack_fffffffffffffeb8),
                                       (QPoint *)
                                       CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0)
                                      );
          local_98 = (QPoint)&DAT_aaaaaaaaaaaaaaaa;
          local_98 = QRect::center((QRect *)CONCAT44(in_stack_fffffffffffffea4,
                                                     in_stack_fffffffffffffea0));
          iVar5 = QRect::x((QRect *)0x4fe895);
          iVar6 = QRect::right((QRect *)0x4fe8a6);
          if (iVar5 < iVar6) {
            iVar5 = QRect::x((QRect *)0x4fe8c1);
            iVar6 = QRect::right((QRect *)0x4fe8d2);
            if ((iVar6 <= iVar5) || ((in_ESI != 0x1000013 && (in_ESI != 0x1000015))))
            goto LAB_004fe98d;
            iVar5 = QPoint::y((QPoint *)0x4fe90b);
            local_9c = QPoint::y((QPoint *)0x4fe91c);
            local_9c = iVar5 - local_9c;
            iVar5 = qAbs<int>(&local_9c);
            iVar6 = QPoint::x((QPoint *)0x4fe94c);
            local_a0 = QPoint::x((QPoint *)0x4fe95d);
            local_a0 = iVar6 - local_a0;
            local_ec = qAbs<int>(&local_a0);
            local_ec = iVar5 * 0x10000 + local_ec;
          }
          else {
LAB_004fe98d:
            in_stack_fffffffffffffec4 = QRect::y((QRect *)0x4fe99a);
            iVar5 = QRect::bottom((QRect *)0x4fe9ab);
            if (in_stack_fffffffffffffec4 < iVar5) {
              in_stack_fffffffffffffec0 = QRect::y((QRect *)0x4fe9c6);
              iVar5 = QRect::bottom((QRect *)0x4fe9d7);
              if ((in_stack_fffffffffffffec0 < iVar5) &&
                 ((in_ESI == 0x1000012 || (in_ESI == 0x1000014)))) {
                in_stack_fffffffffffffeb4 = QPoint::x((QPoint *)0x4fea10);
                local_a4 = QPoint::x((QPoint *)0x4fea21);
                local_a4 = in_stack_fffffffffffffeb4 - local_a4;
                iVar5 = qAbs<int>(&local_a4);
                in_stack_fffffffffffffebc = iVar5 << 0x10;
                in_stack_fffffffffffffeb8 = QPoint::y((QPoint *)0x4fea51);
                local_a8 = QPoint::y((QPoint *)0x4fea62);
                local_a8 = in_stack_fffffffffffffeb8 - local_a8;
                local_ec = qAbs<int>(&local_a8);
                local_ec = in_stack_fffffffffffffebc + local_ec;
                goto LAB_004feb58;
              }
            }
            in_stack_fffffffffffffe98 = QPoint::y((QPoint *)0x4fea9f);
            in_stack_fffffffffffffea0 = QPoint::y((QPoint *)0x4feab0);
            in_stack_fffffffffffffea0 = in_stack_fffffffffffffe98 - in_stack_fffffffffffffea0;
            in_stack_fffffffffffffe9c = QPoint::y((QPoint *)0x4feac9);
            iVar5 = QPoint::y((QPoint *)0x4feada);
            in_stack_fffffffffffffeb0 =
                 in_stack_fffffffffffffea0 * (in_stack_fffffffffffffe9c - iVar5) + 0x40000000;
            in_stack_fffffffffffffea4 = QPoint::x((QPoint *)0x4feaff);
            iVar5 = QPoint::x((QPoint *)0x4feb10);
            iVar5 = in_stack_fffffffffffffea4 - iVar5;
            iVar6 = QPoint::x((QPoint *)0x4feb29);
            iVar7 = QPoint::x((QPoint *)0x4feb3a);
            local_ec = in_stack_fffffffffffffeb0 + iVar5 * (iVar6 - iVar7);
          }
LAB_004feb58:
          if ((local_ec <= local_d4) || (local_d0 == (QWidget *)0x0)) {
            in_stack_fffffffffffffe90 = (QWidget *)(ulong)(in_ESI + 0xfeffffee);
            switch(in_stack_fffffffffffffe90) {
            case (QWidget *)0x0:
              in_stack_fffffffffffffe84 = QPoint::x((QPoint *)0x4fec4d);
              iVar5 = QPoint::x((QPoint *)0x4fec5e);
              if (in_stack_fffffffffffffe84 < iVar5) {
                local_d4 = local_ec;
                local_d0 = this_00;
              }
              break;
            case (QWidget *)0x1:
              in_stack_fffffffffffffe8c = QPoint::y((QPoint *)0x4febb7);
              iVar5 = QPoint::y((QPoint *)0x4febc8);
              if (in_stack_fffffffffffffe8c < iVar5) {
                local_d4 = local_ec;
                local_d0 = this_00;
              }
              break;
            case (QWidget *)0x2:
              in_stack_fffffffffffffe80 = QPoint::x((QPoint *)0x4fec95);
              iVar5 = QPoint::x((QPoint *)0x4feca6);
              if (iVar5 < in_stack_fffffffffffffe80) {
                local_d4 = local_ec;
                local_d0 = this_00;
              }
              break;
            case (QWidget *)0x3:
              in_stack_fffffffffffffe88 = QPoint::y((QPoint *)0x4fec02);
              iVar5 = QPoint::y((QPoint *)0x4fec13);
              if (iVar5 < in_stack_fffffffffffffe88) {
                local_d4 = local_ec;
                local_d0 = this_00;
              }
            }
          }
        }
      }
    }
    if ((((bVar15) && (local_d0 != (QWidget *)0x0)) &&
        (pQVar14 = QAbstractButton::d_func((QAbstractButton *)0x4fed0c),
        ((byte)pQVar14->field_0x28c >> 1 & 1) != 0)) &&
       (pQVar14 = QAbstractButton::d_func((QAbstractButton *)0x4fed2b),
       (pQVar14->field_0x28c & 1) != 0)) {
      QAbstractButton::click
                ((QAbstractButton *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
    }
    if (local_d0 != (QWidget *)0x0) {
      if ((in_ESI == 0x1000013) || (in_ESI == 0x1000012)) {
        QWidget::setFocus((QWidget *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                          in_stack_fffffffffffffebc);
      }
      else {
        QWidget::setFocus((QWidget *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                          in_stack_fffffffffffffebc);
      }
    }
  }
  QList<QAbstractButton_*>::~QList((QList<QAbstractButton_*> *)0x4fedad);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QAbstractButtonPrivate::moveFocus(int key)
{
    QList<QAbstractButton *> buttonList = queryButtonList();
#if QT_CONFIG(buttongroup)
    bool exclusive = group ? group->d_func()->exclusive : autoExclusive;
#else
    bool exclusive = autoExclusive;
#endif
    QWidget *f = QApplication::focusWidget();
    QAbstractButton *fb = qobject_cast<QAbstractButton *>(f);
    if (!fb || !buttonList.contains(fb))
        return;

    QAbstractButton *candidate = nullptr;
    int bestScore = -1;
    QRect target = f->rect().translated(f->mapToGlobal(QPoint(0,0)));
    QPoint goal = target.center();
    uint focus_flag = qt_tab_all_widgets() ? Qt::TabFocus : Qt::StrongFocus;

    for (int i = 0; i < buttonList.size(); ++i) {
        QAbstractButton *button = buttonList.at(i);
        if (button != f && button->window() == f->window() && button->isEnabled() && !button->isHidden() &&
            (exclusive || (button->focusPolicy() & focus_flag) == focus_flag)) {
            QRect buttonRect = button->rect().translated(button->mapToGlobal(QPoint(0,0)));
            QPoint p = buttonRect.center();

            //Priority to widgets that overlap on the same coordinate.
            //In that case, the distance in the direction will be used as significant score,
            //take also in account orthogonal distance in case two widget are in the same distance.
            int score;
            if ((buttonRect.x() < target.right() && target.x() < buttonRect.right())
                  && (key == Qt::Key_Up || key == Qt::Key_Down)) {
                //one item's is at the vertical of the other
                score = (qAbs(p.y() - goal.y()) << 16) + qAbs(p.x() - goal.x());
            } else if ((buttonRect.y() < target.bottom() && target.y() < buttonRect.bottom())
                        && (key == Qt::Key_Left || key == Qt::Key_Right) ) {
                //one item's is at the horizontal of the other
                score = (qAbs(p.x() - goal.x()) << 16) + qAbs(p.y() - goal.y());
            } else {
                score = (1 << 30) + (p.y() - goal.y()) * (p.y() - goal.y()) + (p.x() - goal.x()) * (p.x() - goal.x());
            }

            if (score > bestScore && candidate)
                continue;

            switch(key) {
            case Qt::Key_Up:
                if (p.y() < goal.y()) {
                    candidate = button;
                    bestScore = score;
                }
                break;
            case Qt::Key_Down:
                if (p.y() > goal.y()) {
                    candidate = button;
                    bestScore = score;
                }
                break;
            case Qt::Key_Left:
                if (p.x() < goal.x()) {
                    candidate = button;
                    bestScore = score;
                }
                break;
            case Qt::Key_Right:
                if (p.x() > goal.x()) {
                    candidate = button;
                    bestScore = score;
                }
                break;
            }
        }
    }

    if (exclusive
#ifdef QT_KEYPAD_NAVIGATION
        && !QApplicationPrivate::keypadNavigationEnabled()
#endif
        && candidate
        && fb->d_func()->checked
        && candidate->d_func()->checkable)
        candidate->click();

    if (candidate) {
        if (key == Qt::Key_Up || key == Qt::Key_Left)
            candidate->setFocus(Qt::BacktabFocusReason);
        else
            candidate->setFocus(Qt::TabFocusReason);
    }
}